

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

PathDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PathDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::PathDescriptionSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          PathDescriptionSyntax *args_1,Token *args_2,Token *args_3,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_4,Token *args_5,Token *args_6)

{
  Token equals;
  Token openParen;
  Token closeParen;
  Token semi;
  PathDeclarationSyntax *this_00;
  
  this_00 = (PathDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PathDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (PathDeclarationSyntax *)allocateSlow(this,0xd0,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  equals.kind = args_2->kind;
  equals._2_1_ = args_2->field_0x2;
  equals.numFlags.raw = (args_2->numFlags).raw;
  equals.rawLen = args_2->rawLen;
  equals.info = args_2->info;
  semi.kind = args_6->kind;
  semi._2_1_ = args_6->field_0x2;
  semi.numFlags.raw = (args_6->numFlags).raw;
  semi.rawLen = args_6->rawLen;
  semi.info = args_6->info;
  closeParen.kind = args_5->kind;
  closeParen._2_1_ = args_5->field_0x2;
  closeParen.numFlags.raw = (args_5->numFlags).raw;
  closeParen.rawLen = args_5->rawLen;
  closeParen.info = args_5->info;
  openParen.kind = args_3->kind;
  openParen._2_1_ = args_3->field_0x2;
  openParen.numFlags.raw = (args_3->numFlags).raw;
  openParen.rawLen = args_3->rawLen;
  openParen.info = args_3->info;
  slang::syntax::PathDeclarationSyntax::PathDeclarationSyntax
            (this_00,args,args_1,equals,openParen,args_4,closeParen,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }